

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oasis.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
remove_extension<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename)

{
  pointer pcVar1;
  long lVar2;
  
  lVar2 = std::__cxx11::string::rfind((char)filename,0x2e);
  if (lVar2 - 1U < 0xfffffffffffffffe) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

T remove_extension(T const& filename)
{
	typename T::size_type const p(filename.find_last_of('.'));
	return p > 0 && p != T::npos ? filename.substr(0, p) : filename;
}